

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_> *
parseFunctionInvocationLike<BuiltInFunctionInvocationExpressionAstNode>
          (optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>
           *__return_storage_ptr__,Parser *parser,TokenType tokenTypeToExpect)

{
  int iVar1;
  size_t *psVar2;
  TokenType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 local_f8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined1 local_d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [16];
  shared_ptr<Token> identifier;
  vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
  arguments;
  undefined1 local_78 [8];
  size_type __dnew;
  bool local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  TokenBuffer local_58;
  bool error;
  
  local_58.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = '\0';
  identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar2 = (size_t *)
           ((long)&local_58.tokenList.
                   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
           + 0x10);
  local_78 = (undefined1  [8])0x2e;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)psVar2;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next =
       (_List_node_base *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)local_78);
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  ._M_size = (size_t)local_78;
  *(undefined8 *)
   ((long)&local_58.tokenList.
           super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl._M_node.super__List_node_base._M_next[1]._M_prev + 6) = 0x6e69206e6f697463;
  *(undefined8 *)
   ((long)&local_58.tokenList.
           super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl._M_node.super__List_node_base._M_next[2]._M_next + 6) = 0x6e6f697461636f76;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[1]._M_next = (_List_node_base *)0x6620726569666974;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[1]._M_prev = (_List_node_base *)0x74636e756620726f;
  (local_58.tokenList.
   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
   _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x6465746365707845;
  (local_58.tokenList.
   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
   _M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)0x6e656469206e6120;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_78;
  *(undefined1 *)
   ((long)&(local_58.tokenList.
            super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
            _M_impl._M_node.super__List_node_base._M_next)->_M_next + (long)local_78) = 0;
  type = (TokenType)parser;
  Parser::expect((Parser *)&stack0xffffffffffffff58,type,(bool *)(ulong)tokenTypeToExpect,
                 (string *)
                 ((long)&local_58.tokenizer.
                         super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2> + 0xf));
  if (local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(local_58.tokenList.
                    super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,
                    (ulong)((long)(_List_node_base **)
                                  local_58.tokenList.
                                  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                                  ._M_impl._M_node._M_size + 1));
  }
  Parser::skipWhiteSpace(parser);
  local_78 = (undefined1  [8])0x2b;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)psVar2;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next =
       (_List_node_base *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)local_78);
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  ._M_size = (size_t)local_78;
  *(undefined8 *)
   ((long)&local_58.tokenList.
           super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl._M_node.super__List_node_base._M_next[1]._M_prev + 3) = 0x6e69206e6f697463;
  *(undefined8 *)
   ((long)&local_58.tokenList.
           super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl._M_node.super__List_node_base._M_next[2]._M_next + 3) = 0x6e6f697461636f76;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[1]._M_next = (_List_node_base *)0x20726f66206e6572;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[1]._M_prev = (_List_node_base *)0x6e6f6974636e7566;
  (local_58.tokenList.
   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
   _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x6465746365707845;
  (local_58.tokenList.
   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
   _M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)0x6170207466656c20;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_78;
  *(undefined1 *)
   ((long)&(local_58.tokenList.
            super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
            _M_impl._M_node.super__List_node_base._M_next)->_M_next + (long)local_78) = 0;
  Parser::expect((Parser *)local_f8,type,(bool *)0x5,
                 (string *)
                 ((long)&local_58.tokenizer.
                         super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2> + 0xf));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if (local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(local_58.tokenList.
                    super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,
                    (ulong)((long)(_func_int ***)
                                  local_58.tokenList.
                                  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                                  ._M_impl._M_node._M_size + 1));
  }
  while( true ) {
    Parser::skipWhiteSpace(parser);
    TokenBuffer::currentToken(&local_58);
    iVar1 = *(int *)&local_58.tokenList.
                     super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_58.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node.super__List_node_base._M_prev);
    }
    if (iVar1 == 1) {
      local_78 = (undefined1  [8])0x33;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next =
           (_List_node_base *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)local_78);
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node._M_size = (size_t)local_78;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x6e6f6974636e7566;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x7461636f766e6920;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[1]._M_next = (_List_node_base *)0x74206e6572617020;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[1]._M_prev = (_List_node_base *)0x2065736f6c63206f;
      (local_58.tokenList.
       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x6465746365707845;
      (local_58.tokenList.
       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)0x7468676972206120;
      *(undefined4 *)
       ((long)&local_58.tokenList.
               super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl._M_node.super__List_node_base._M_next[2]._M_prev + 7) = 0x6e6f6974;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)local_78;
      *(undefined1 *)
       ((long)&(local_58.tokenList.
                super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                _M_impl._M_node.super__List_node_base._M_next)->_M_next + (long)local_78) = 0;
      Parser::expect((Parser *)(local_f8 + 0x10),type,(bool *)0x6,
                     (string *)
                     ((long)&local_58.tokenizer.
                             super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2> + 0xf));
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
      }
      if (local_58.tokenList.
          super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl
          ._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(local_58.tokenList.
                        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        (ulong)((long)(_func_int ***)
                                      local_58.tokenList.
                                      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                                      ._M_impl._M_node._M_size + 1));
      }
      goto LAB_0010e55d;
    }
    TokenBuffer::currentToken(&local_58);
    iVar1 = *(int *)&local_58.tokenList.
                     super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_58.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node.super__List_node_base._M_prev);
    }
    if (iVar1 == 6) break;
    Parser::parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_78,parser);
    if (local_68 == false) {
      local_58.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._7_1_ = '\x01';
    }
    else {
      std::
      vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ::push_back((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                   *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  (value_type *)local_78);
    }
    TokenBuffer::currentToken(&local_58);
    iVar1 = *(int *)&local_58.tokenList.
                     super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_58.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node.super__List_node_base._M_prev);
    }
    if (iVar1 == 6) {
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x33;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next =
           (_List_node_base *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node._M_size = (size_t)local_60;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x6e6f6974636e7566;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x7461636f766e6920;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[1]._M_next = (_List_node_base *)0x74206e6572617020;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[1]._M_prev = (_List_node_base *)0x2065736f6c63206f;
      (local_58.tokenList.
       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x6465746365707845;
      (local_58.tokenList.
       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)0x7468676972206120;
      *(undefined4 *)
       ((long)&local_58.tokenList.
               super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl._M_node.super__List_node_base._M_next[2]._M_prev + 7) = 0x6e6f6974;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)local_60;
      *(undefined1 *)
       ((long)&local_60->_vptr__Sp_counted_base +
       (long)&(local_58.tokenList.
               super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl._M_node.super__List_node_base._M_next)->_M_next) = 0;
      Parser::expect((Parser *)(local_d8 + 0x10),type,(bool *)0x6,
                     (string *)
                     ((long)&local_58.tokenizer.
                             super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2> + 0xf));
      this = local_c0;
    }
    else {
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2b;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next =
           (_List_node_base *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node._M_size = (size_t)local_60;
      *(undefined8 *)
       ((long)&local_58.tokenList.
               super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl._M_node.super__List_node_base._M_next[1]._M_prev + 3) = 0x61206e6f6974636e;
      *(undefined8 *)
       ((long)&local_58.tokenList.
               super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl._M_node.super__List_node_base._M_next[2]._M_next + 3) = 0x73746e656d756772;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[1]._M_next = (_List_node_base *)0x6e65657774656220;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next[1]._M_prev = (_List_node_base *)0x6f6974636e756620;
      (local_58.tokenList.
       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x6465746365707845;
      (local_58.tokenList.
       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)0x616d6d6f63206120;
      local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)local_60;
      *(undefined1 *)
       ((long)&local_60->_vptr__Sp_counted_base +
       (long)&(local_58.tokenList.
               super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
               _M_impl._M_node.super__List_node_base._M_next)->_M_next) = 0;
      Parser::expect((Parser *)local_b8,type,(bool *)0x13,
                     (string *)
                     ((long)&local_58.tokenizer.
                             super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2> + 0xf));
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (local_58.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
      operator_delete(local_58.tokenList.
                      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                      (ulong)((long)(_func_int ***)
                                    local_58.tokenList.
                                    super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                                    ._M_impl._M_node._M_size + 1));
    }
    if ((local_68 == true) && (local_68 = false, __dnew != 0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__dnew);
    }
    if (iVar1 == 6) {
LAB_0010e553:
      if (local_58.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._7_1_ == '\x01') {
LAB_0010e55d:
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>.
        _M_engaged = false;
      }
      else {
        local_58.tokenList.
        super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BuiltInFunctionInvocationExpressionAstNode,std::allocator<BuiltInFunctionInvocationExpressionAstNode>,std::shared_ptr<Token>&,std::vector<std::shared_ptr<ExpressionAstNode>,std::allocator<std::shared_ptr<ExpressionAstNode>>>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_58.tokenList.
                           super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                   + 8),(BuiltInFunctionInvocationExpressionAstNode **)&local_58,
                   (allocator<BuiltInFunctionInvocationExpressionAstNode> *)local_78,
                   (shared_ptr<Token> *)&stack0xffffffffffffff58,
                   (vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                    *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>.
        _M_payload._M_value.
        super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 local_58.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>.
        _M_payload._M_value.
        super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_58.tokenList.
             super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
        (__return_storage_ptr__->
        super__Optional_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_true,_false,_false>
        .super__Optional_payload_base<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_>.
        _M_engaged = true;
      }
      if (identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      std::
      vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
      ::~vector((vector<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                 *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
  }
  local_78 = (undefined1  [8])0x33;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)psVar2;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next =
       (_List_node_base *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)local_78);
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  ._M_size = (size_t)local_78;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[2]._M_next = (_List_node_base *)0x6e6f6974636e7566;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[2]._M_prev = (_List_node_base *)0x7461636f766e6920;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[1]._M_next = (_List_node_base *)0x74206e6572617020;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_next[1]._M_prev = (_List_node_base *)0x2065736f6c63206f;
  (local_58.tokenList.
   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
   _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x6465746365707845;
  (local_58.tokenList.
   super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
   _M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)0x7468676972206120;
  *(undefined4 *)
   ((long)&local_58.tokenList.
           super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl._M_node.super__List_node_base._M_next[2]._M_prev + 7) = 0x6e6f6974;
  local_58.tokenList.
  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_78;
  *(undefined1 *)
   ((long)&(local_58.tokenList.
            super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
            _M_impl._M_node.super__List_node_base._M_next)->_M_next + (long)local_78) = 0;
  Parser::expect((Parser *)local_d8,type,(bool *)0x6,
                 (string *)
                 ((long)&local_58.tokenizer.
                         super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2> + 0xf));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  if (local_58.tokenList.
      super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(local_58.tokenList.
                    super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,
                    (ulong)((long)(_func_int ***)
                                  local_58.tokenList.
                                  super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                                  ._M_impl._M_node._M_size + 1));
  }
  goto LAB_0010e553;
}

Assistant:

const std::optional<std::shared_ptr<T>> parseFunctionInvocationLike(Parser* parser, TokenType tokenTypeToExpect) {
  bool error = false;
  std::vector<std::shared_ptr<ExpressionAstNode>> arguments;

  auto identifier = parser->expect(tokenTypeToExpect, error,
    "Expected an identifier for function invocation");

  parser->skipWhiteSpace();

  parser->expect(TokenType::LeftParen, error, "Expected left paren for function invocation");

  while (true) {
    parser->skipWhiteSpace();

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      return std::nullopt;
    }

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      break;
    }

    auto arg = parser->parseExpression();

    if (!arg) {
      error = true;

    } else {
      arguments.push_back(arg.value());
    }

    if (parser->tokenBuffer->currentToken()->tokenType == TokenType::RightParen) {
      parser->expect(TokenType::RightParen, error,
        "Expected a right paren to close function invocation");
      break;
    }

    parser->expect(TokenType::Comma, error, "Expected a comma between function arguments");
  }

  if (error) { return std::nullopt; }

  return std::make_shared<T>(identifier, arguments);
}